

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.h
# Opt level: O0

double __thiscall sdf::Box::signedDistance(Box *this,Vector3d *location)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Matrix<double,_3,_1,_0,_3,_1> *this_00;
  Scalar *__a;
  Scalar *__b;
  double *pdVar7;
  long in_RDI;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *this_01;
  double dVar8;
  Scalar *z;
  Scalar *y;
  Scalar *x;
  double dVar9;
  double value;
  Vector3d mdz;
  Vector3d dist;
  Index in_stack_ffffffffffffff08;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_ffffffffffffff10;
  double local_68 [2];
  double local_58;
  double local_50;
  double local_48 [9];
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1594f4);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
            ((ulong)*pSVar5 & 0x7fffffffffffffff);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     (this_01,in_stack_ffffffffffffff08);
  dVar8 = (double)this_01 - *pSVar6 / 2.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  *pSVar5 = dVar8;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  dVar8 = *pSVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     (this_01,in_stack_ffffffffffffff08);
  z = (Scalar *)(ABS(dVar8) - *pSVar6 / 2.0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  *pSVar5 = (Scalar)z;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  y = (Scalar *)((ulong)*pSVar5 & 0x7fffffffffffffff);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     (this_01,in_stack_ffffffffffffff08);
  x = (Scalar *)((double)y - *pSVar6 / 2.0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  *pSVar5 = (Scalar)x;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  local_48[0] = 0.0;
  this_00 = (Matrix<double,_3,_1,_0,_3,_1> *)std::max<double>(pSVar5,local_48);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  local_50 = 0.0;
  std::max<double>(pSVar5,&local_50);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  local_58 = 0.0;
  std::max<double>(pSVar5,&local_58);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(this_00,x,y,z);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  __a = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                   in_stack_ffffffffffffff08);
  __b = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                   in_stack_ffffffffffffff08);
  pdVar7 = std::max<double>(__a,__b);
  pdVar7 = std::max<double>(pSVar5,pdVar7);
  local_68[0] = 0.0;
  pdVar7 = std::min<double>(pdVar7,local_68);
  dVar8 = *pdVar7;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  dVar9 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this_01,
                      in_stack_ffffffffffffff08);
  dVar9 = sqrt(dVar4 * *pSVar5 + dVar9 * dVar1 + dVar2 * dVar3);
  dVar8 = dVar8 + dVar9;
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    dVar8 = -dVar8;
  }
  return dVar8;
}

Assistant:

double signedDistance(Eigen::Vector3d &location)
    { 
   
      Eigen::Vector3d dist;
      dist(0) = fabs(location(0)) - (parameters(0)/2);
      dist(1) = fabs(location(1)) - (parameters(1)/2);
      dist(2) = fabs(location(2)) - (parameters(2)/2);
      Eigen::Vector3d mdz( std::max(dist(0), 0.0),std::max(dist(1), 0.0),std::max(dist(2), 0.0));

      double value = std::min(  std::max(  dist(0), std::max(  dist(1), dist(2)  ) ), 0.0  )  + sqrt(mdz(0)*mdz(0) + mdz(1)*mdz(1) + mdz(2)*mdz(2)); 
      return (invert) ? -value : value;
    }